

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O2

void __thiscall cmGlobalGenerator::Configure(cmGlobalGenerator *this)

{
  cmMakefile *pcVar1;
  cmake *pcVar2;
  Snapshot snapshot;
  bool bVar3;
  char *pcVar4;
  ostream *poVar5;
  char **log;
  undefined **ppuVar6;
  allocator local_259;
  cmLocalGenerator *lg;
  string f;
  ostringstream msg;
  char num [100];
  Snapshot local_48;
  
  this->FirstTimeProgress = 0.0;
  ClearGeneratorMembers(this);
  cmState::Snapshot::Snapshot(&local_48,(cmState *)0x0,(PositionType)ZEXT816(0));
  snapshot.Position.Tree = local_48.Position.Tree;
  snapshot.State = local_48.State;
  snapshot.Position.Position = local_48.Position.Position;
  lg = MakeLocalGenerator(this,snapshot,(cmLocalGenerator *)0x0);
  std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::push_back
            (&this->LocalGenerators,&lg);
  pcVar1 = lg->Makefile;
  pcVar4 = cmake::GetHomeDirectory(this->CMakeInstance);
  std::__cxx11::string::string((string *)&msg,pcVar4,(allocator *)num);
  cmMakefile::SetCurrentSourceDirectory(pcVar1,(string *)&msg);
  std::__cxx11::string::~string((string *)&msg);
  pcVar1 = lg->Makefile;
  pcVar4 = cmake::GetHomeOutputDirectory(this->CMakeInstance);
  std::__cxx11::string::string((string *)&msg,pcVar4,(allocator *)num);
  cmMakefile::SetCurrentBinaryDirectory(pcVar1,(string *)&msg);
  std::__cxx11::string::~string((string *)&msg);
  pcVar4 = cmake::GetHomeOutputDirectory(this->CMakeInstance);
  std::__cxx11::string::string((string *)&msg,pcVar4,(allocator *)num);
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)&this->BinaryDirectories,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&msg);
  std::__cxx11::string::~string((string *)&msg);
  cmMakefile::Configure(lg->Makefile);
  sprintf(num,"%d",(ulong)((long)(this->LocalGenerators).
                                 super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(this->LocalGenerators).
                                super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 3);
  pcVar2 = this->CMakeInstance;
  std::__cxx11::string::string((string *)&msg,"CMAKE_NUMBER_OF_LOCAL_GENERATORS",(allocator *)&f);
  cmake::AddCacheEntry(pcVar2,(string *)&msg,num,"number of local generators",4);
  std::__cxx11::string::~string((string *)&msg);
  CheckLocalGenerators(this);
  FillProjectMap(this);
  if (this->CMakeInstance->CurrentWorkingMode == NORMAL_MODE) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&msg);
    bVar3 = cmSystemTools::GetErrorOccuredFlag();
    if (bVar3) {
      std::operator<<((ostream *)&msg,"Configuring incomplete, errors occurred!");
      for (ppuVar6 = &PTR_anon_var_dwarf_b5993_00584990; *ppuVar6 != (undefined *)0x0;
          ppuVar6 = ppuVar6 + 1) {
        pcVar4 = cmake::GetHomeOutputDirectory(this->CMakeInstance);
        std::__cxx11::string::string((string *)&f,pcVar4,&local_259);
        std::__cxx11::string::append((char *)&f);
        std::__cxx11::string::append((char *)&f);
        std::__cxx11::string::append((char *)&f);
        bVar3 = cmsys::SystemTools::FileExists(f._M_dataplus._M_p);
        if (bVar3) {
          poVar5 = std::operator<<((ostream *)&msg,"\nSee also \"");
          poVar5 = std::operator<<(poVar5,(string *)&f);
          std::operator<<(poVar5,"\".");
        }
        std::__cxx11::string::~string((string *)&f);
      }
    }
    else {
      std::operator<<((ostream *)&msg,"Configuring done");
    }
    pcVar2 = this->CMakeInstance;
    std::__cxx11::stringbuf::str();
    cmake::UpdateProgress(pcVar2,f._M_dataplus._M_p,-1.0);
    std::__cxx11::string::~string((string *)&f);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&msg);
  }
  return;
}

Assistant:

void cmGlobalGenerator::Configure()
{
  this->FirstTimeProgress = 0.0f;
  this->ClearGeneratorMembers();

  // start with this directory
  cmLocalGenerator *lg = this->MakeLocalGenerator();
  this->LocalGenerators.push_back(lg);

  // set the Start directories
  lg->GetMakefile()->SetCurrentSourceDirectory
    (this->CMakeInstance->GetHomeDirectory());
  lg->GetMakefile()->SetCurrentBinaryDirectory
    (this->CMakeInstance->GetHomeOutputDirectory());

  this->BinaryDirectories.insert(
      this->CMakeInstance->GetHomeOutputDirectory());

  // now do it
  lg->GetMakefile()->Configure();

  // update the cache entry for the number of local generators, this is used
  // for progress
  char num[100];
  sprintf(num,"%d",static_cast<int>(this->LocalGenerators.size()));
  this->GetCMakeInstance()->AddCacheEntry
    ("CMAKE_NUMBER_OF_LOCAL_GENERATORS", num,
     "number of local generators", cmState::INTERNAL);

  // check for link libraries and include directories containing "NOTFOUND"
  // and for infinite loops
  this->CheckLocalGenerators();

  // at this point this->LocalGenerators has been filled,
  // so create the map from project name to vector of local generators
  this->FillProjectMap();

  if ( this->CMakeInstance->GetWorkingMode() == cmake::NORMAL_MODE)
    {
    std::ostringstream msg;
    if(cmSystemTools::GetErrorOccuredFlag())
      {
      msg << "Configuring incomplete, errors occurred!";
      const char* logs[] = {"CMakeOutput.log", "CMakeError.log", 0};
      for(const char** log = logs; *log; ++log)
        {
        std::string f = this->CMakeInstance->GetHomeOutputDirectory();
        f += this->CMakeInstance->GetCMakeFilesDirectory();
        f += "/";
        f += *log;
        if(cmSystemTools::FileExists(f.c_str()))
          {
          msg << "\nSee also \"" << f << "\".";
          }
        }
      }
    else
      {
      msg << "Configuring done";
      }
    this->CMakeInstance->UpdateProgress(msg.str().c_str(), -1);
    }
}